

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

int __thiscall
chaiscript::detail::Any::Data_Impl<std::reference_wrapper<const_chaiscript::AST_Node>_>::clone
          (Data_Impl<std::reference_wrapper<const_chaiscript::AST_Node>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  AST_Node *in_RAX;
  reference_wrapper<const_chaiscript::AST_Node> local_18;
  
  local_18._M_data = in_RAX;
  std::
  make_unique<chaiscript::detail::Any::Data_Impl<std::reference_wrapper<chaiscript::AST_Node_const>>,std::reference_wrapper<chaiscript::AST_Node_const>const&>
            (&local_18);
  (this->super_Data)._vptr_Data = (_func_int **)local_18._M_data;
  return (int)this;
}

Assistant:

std::unique_ptr<Data> clone() const override { return std::make_unique<Data_Impl<T>>(m_data); }